

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroupTransferable
          (HashSetResizeHelper *this,CommonFields *c,size_t slot_size)

{
  ulong new_capacity;
  
  if (7 < this->old_capacity_) {
    __assert_fail("old_capacity_ < Group::kWidth / 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x1f7,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroupTransferable(CommonFields &, size_t)"
                 );
  }
  new_capacity = c->capacity_;
  if (new_capacity < 0x11) {
    if (this->old_capacity_ < new_capacity) {
      GrowIntoSingleGroupShuffleControlBytes(this,(c->heap_or_soo_).heap.control,new_capacity);
      GrowIntoSingleGroupShuffleTransferableSlots
                (this,(c->heap_or_soo_).heap.slot_array.p,slot_size);
      return;
    }
    __assert_fail("IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x1f9,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroupTransferable(CommonFields &, size_t)"
                 );
  }
  __assert_fail("is_single_group(c.capacity())",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                ,0x1f8,
                "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroupTransferable(CommonFields &, size_t)"
               );
}

Assistant:

void HashSetResizeHelper::GrowSizeIntoSingleGroupTransferable(
    CommonFields& c, size_t slot_size) {
  assert(old_capacity_ < Group::kWidth / 2);
  assert(is_single_group(c.capacity()));
  assert(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity()));

  GrowIntoSingleGroupShuffleControlBytes(c.control(), c.capacity());
  GrowIntoSingleGroupShuffleTransferableSlots(c.slot_array(), slot_size);

  // We poison since GrowIntoSingleGroupShuffleTransferableSlots
  // may leave empty slots unpoisoned.
  PoisonSingleGroupEmptySlots(c, slot_size);
}